

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O0

bool __thiscall
draco::Metadata::GetEntryDoubleArray
          (Metadata *this,string *name,vector<double,_std::allocator<double>_> *value)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  
  bVar1 = GetEntry<std::vector<double,std::allocator<double>>>
                    ((Metadata *)name,(string *)value,in_RDI);
  return bVar1;
}

Assistant:

bool Metadata::GetEntryDoubleArray(const std::string &name,
                                   std::vector<double> *value) const {
  return GetEntry(name, value);
}